

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TLaplaceExampleTimeDependent::uxy<Fad<Fad<double>>>
          (TLaplaceExampleTimeDependent *this,TPZVec<Fad<Fad<double>_>_> *x,
          TPZVec<Fad<Fad<double>_>_> *disp)

{
  int iVar1;
  Fad<Fad<double>_> *pFVar2;
  Fad<Fad<double>_> *pFVar3;
  FADFADSTATE *pFVar4;
  FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> local_398;
  FADFADSTATE local_388;
  FADFADSTATE local_330;
  FADFADSTATE local_2d8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  local_280;
  FADFADSTATE local_270;
  FADFADSTATE local_218;
  FADFADSTATE local_1c0;
  FADFADSTATE local_168;
  FADFADSTATE local_110;
  FADFADSTATE local_b8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> local_60;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> local_40;
  
  iVar1 = *(int *)&(this->super_TPZAnalyticSolution).field_0xc;
  if (iVar1 == 3) {
    local_40.fadexpr_.right_ = x->fStore;
    local_40.fadexpr_.left_.constant_ = 1.5707963267948966;
    local_40.fadexpr_.left_.defaultVal = 0.0;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_218,&local_40);
    FADcos(&local_2d8,&local_218);
    local_60.fadexpr_.right_ = x->fStore + 1;
    local_60.fadexpr_.left_.constant_ = 1.5707963267948966;
    local_60.fadexpr_.left_.defaultVal = 0.0;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_270,&local_60);
    FADcos(&local_330,&local_270);
    local_110.val_.val_ = this->fTime * -4.934802200544679;
    local_110.val_.dx_.num_elts = 0;
    local_110.defaultVal.dx_.ptr_to_data = (double *)0x0;
    local_110.defaultVal.defaultVal = 0.0;
    local_110.val_.dx_.ptr_to_data = (double *)0x0;
    local_110.val_.defaultVal = 0.0;
    local_110.dx_.num_elts = 0;
    local_110.dx_.ptr_to_data = (Fad<double> *)0x0;
    local_110.defaultVal.val_ = 0.0;
    local_110.defaultVal.dx_.num_elts = 0;
    local_398.fadexpr_.left_ = &local_2d8;
    local_398.fadexpr_.right_ = &local_330;
    FADexp(&local_388,&local_110);
    local_280.fadexpr_.left_ = &local_398;
    local_280.fadexpr_.right_ = &local_388;
    Fad<Fad<double>>::operator=((Fad<Fad<double>> *)disp->fStore,&local_280);
    Fad<double>::~Fad(&local_388.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_388.dx_);
    Fad<double>::~Fad(&local_388.val_);
    Fad<double>::~Fad(&local_110.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_110.dx_);
    Fad<double>::~Fad(&local_110.val_);
    Fad<double>::~Fad(&local_330.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_330.dx_);
    Fad<double>::~Fad(&local_330.val_);
    Fad<double>::~Fad(&local_270.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_270.dx_);
    Fad<double>::~Fad(&local_270.val_);
    Fad<double>::~Fad(&local_2d8.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_2d8.dx_);
    Fad<double>::~Fad(&local_2d8.val_);
    Fad<double>::~Fad(&local_218.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_218.dx_);
    pFVar4 = &local_218;
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 1) {
        pFVar2 = x->fStore;
        pFVar3 = disp->fStore;
        (pFVar3->val_).val_ = (pFVar2->val_).val_;
        Vector<double>::operator=(&(pFVar3->val_).dx_,&(pFVar2->val_).dx_);
        (pFVar3->val_).defaultVal = (pFVar2->val_).defaultVal;
        Vector<Fad<double>_>::operator=(&pFVar3->dx_,&pFVar2->dx_);
        (pFVar3->defaultVal).val_ = (pFVar2->defaultVal).val_;
        Vector<double>::operator=(&(pFVar3->defaultVal).dx_,&(pFVar2->defaultVal).dx_);
        (pFVar3->defaultVal).defaultVal = (pFVar2->defaultVal).defaultVal;
        return;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
                 ,0x814);
    }
    local_40.fadexpr_.right_ = x->fStore;
    local_40.fadexpr_.left_.constant_ = 3.141592653589793;
    local_40.fadexpr_.left_.defaultVal = 0.0;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_168,&local_40);
    FADsin(&local_2d8,&local_168);
    local_60.fadexpr_.right_ = x->fStore + 1;
    local_60.fadexpr_.left_.constant_ = 3.141592653589793;
    local_60.fadexpr_.left_.defaultVal = 0.0;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_1c0,&local_60);
    FADsin(&local_330,&local_1c0);
    local_b8.val_.val_ = this->fTime * -19.739208802178716;
    local_b8.val_.dx_.num_elts = 0;
    local_b8.defaultVal.dx_.ptr_to_data = (double *)0x0;
    local_b8.defaultVal.defaultVal = 0.0;
    local_b8.val_.dx_.ptr_to_data = (double *)0x0;
    local_b8.val_.defaultVal = 0.0;
    local_b8.dx_.num_elts = 0;
    local_b8.dx_.ptr_to_data = (Fad<double> *)0x0;
    local_b8.defaultVal.val_ = 0.0;
    local_b8.defaultVal.dx_.num_elts = 0;
    local_398.fadexpr_.left_ = &local_2d8;
    local_398.fadexpr_.right_ = &local_330;
    FADexp(&local_388,&local_b8);
    local_280.fadexpr_.left_ = &local_398;
    local_280.fadexpr_.right_ = &local_388;
    Fad<Fad<double>>::operator=((Fad<Fad<double>> *)disp->fStore,&local_280);
    Fad<double>::~Fad(&local_388.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_388.dx_);
    Fad<double>::~Fad(&local_388.val_);
    Fad<double>::~Fad(&local_b8.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_b8.dx_);
    Fad<double>::~Fad(&local_b8.val_);
    Fad<double>::~Fad(&local_330.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_330.dx_);
    Fad<double>::~Fad(&local_330.val_);
    Fad<double>::~Fad(&local_1c0.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_1c0.dx_);
    Fad<double>::~Fad(&local_1c0.val_);
    Fad<double>::~Fad(&local_2d8.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_2d8.dx_);
    Fad<double>::~Fad(&local_2d8.val_);
    Fad<double>::~Fad(&local_168.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_168.dx_);
    pFVar4 = &local_168;
  }
  Fad<double>::~Fad(&pFVar4->val_);
  return;
}

Assistant:

void TLaplaceExampleTimeDependent::uxy(const TPZVec<FADFADSTATE > &x, TPZVec<FADFADSTATE > &disp) const
{
    switch(fProblemType)
    {
        case ELinear:
            disp[0] = x[0];
            break;
        case ESin:
            disp[0] = FADsin(M_PI*x[0])*FADsin(M_PI*x[1])*FADexp(-2.*M_PI*M_PI*fTime);
            break;
        case ECos:
            disp[0] = FADcos(M_PI_2*x[0])*FADcos(M_PI_2*x[1])*FADexp(-M_PI*M_PI_2*fTime);
            break;
        default:
            DebugStop();
    }

}